

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

ssize_t __thiscall
capnp::anon_unknown_34::BrokenRequest::send
          (BrokenRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined4 in_register_00000034;
  void *pvVar1;
  undefined1 local_208 [88];
  Exception local_1b0;
  Promise<capnp::Response<capnp::AnyPointer>_> local_20 [2];
  BrokenRequest *this_local;
  
  pvVar1 = (void *)CONCAT44(in_register_00000034,__fd);
  local_20[1].super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)pvVar1;
  this_local = this;
  kj::cp<kj::Exception>(&local_1b0,(Exception *)((long)pvVar1 + 0x10));
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise(local_20,&local_1b0);
  kj::refcounted<capnp::(anonymous_namespace)::BrokenPipeline,kj::Exception&>
            ((kj *)local_208,(Exception *)((long)pvVar1 + 0x10));
  kj::Own<capnp::PipelineHook,decltype(nullptr)>::
  Own<capnp::(anonymous_namespace)::BrokenPipeline,void>
            ((Own<capnp::PipelineHook,decltype(nullptr)> *)(local_208 + 0x10),
             (Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t> *)local_208);
  AnyPointer::Pipeline::Pipeline
            ((Pipeline *)(local_208 + 0x20),
             (Own<capnp::PipelineHook,_std::nullptr_t> *)(local_208 + 0x10));
  RemotePromise<capnp::AnyPointer>::RemotePromise
            ((RemotePromise<capnp::AnyPointer> *)this,local_20,(Pipeline *)(local_208 + 0x20));
  AnyPointer::Pipeline::~Pipeline((Pipeline *)(local_208 + 0x20));
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own
            ((Own<capnp::PipelineHook,_std::nullptr_t> *)(local_208 + 0x10));
  kj::Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t>::~Own
            ((Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t> *)local_208);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise(local_20);
  kj::Exception::~Exception(&local_1b0);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
    return RemotePromise<AnyPointer>(kj::cp(exception),
        AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception)));
  }